

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void term_destination(j_compress_ptr cinfo)

{
  long lVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  long *in_RDI;
  size_t datacount;
  my_dest_ptr dest;
  
  lVar1 = in_RDI[5];
  __n = 0x1000 - *(long *)(lVar1 + 8);
  if ((__n != 0) &&
     (sVar3 = fwrite(*(void **)(lVar1 + 0x30),1,__n,*(FILE **)(lVar1 + 0x28)), sVar3 != __n)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  fflush(*(FILE **)(lVar1 + 0x28));
  iVar2 = ferror(*(FILE **)(lVar1 + 0x28));
  if (iVar2 != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
term_destination(j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr)cinfo->dest;
  size_t datacount = OUTPUT_BUF_SIZE - dest->pub.free_in_buffer;

  /* Write any data remaining in the buffer */
  if (datacount > 0) {
    if (JFWRITE(dest->outfile, dest->buffer, datacount) != datacount)
      ERREXIT(cinfo, JERR_FILE_WRITE);
  }
  fflush(dest->outfile);
  /* Make sure we wrote the output file OK */
  if (ferror(dest->outfile))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}